

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O1

Fantasy_Character_union_ref_t
Fantasy_Character_clone(flatbuffers_builder_t *B,Fantasy_Character_union_t u)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  undefined2 *puVar4;
  int *piVar5;
  void *pvVar6;
  int *s;
  size_t sVar7;
  Fantasy_Character_union_ref_t FVar8;
  
  s = (int *)u.value;
  uVar2 = u._0_4_ & 0xff;
  FVar8.type = '\0';
  FVar8._1_3_ = 0;
  FVar8.value = 0;
  switch(uVar2) {
  case 2:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,s);
    }
    if (uVar2 == 0) {
      iVar3 = flatcc_builder_start_table(B,1);
      uVar2 = 0;
      if (iVar3 == 0) {
        if (s == (int *)0x0) {
          __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                        ,0x487,
                        "const int32_t *Fantasy_Attacker_sword_attack_damage_get_ptr(Fantasy_Attacker_table_t)"
                       );
        }
        if (*(ushort *)((long)s - (long)*s) < 6) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(ushort *)((long)s + (4 - (long)*s));
        }
        if (uVar1 != 0) {
          uVar2 = 0;
          pvVar6 = flatcc_builder_table_add_copy(B,0,(void *)((ulong)uVar1 + (long)s),4,4);
          if (pvVar6 == (void *)0x0) goto LAB_00113a0e;
        }
        iVar3 = flatcc_builder_check_required(B,__Fantasy_Attacker_required,0);
        if (iVar3 == 0) {
          __assert_fail("flatcc_builder_check_required(B, __Fantasy_Attacker_required, sizeof(__Fantasy_Attacker_required) / sizeof(__Fantasy_Attacker_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_builder.h"
                        ,0x153,
                        "Fantasy_Attacker_ref_t Fantasy_Attacker_end(flatbuffers_builder_t *)");
        }
        uVar2 = flatcc_builder_end_table(B);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar2 = flatcc_refmap_insert(B->refmap,s,uVar2);
        }
      }
    }
LAB_00113a0e:
    FVar8 = (Fantasy_Character_union_ref_t)((ulong)uVar2 << 0x20 | 2);
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,s);
    }
    if (uVar2 == 0) {
      puVar4 = (undefined2 *)flatcc_builder_start_struct(B,8,4);
      if (puVar4 == (undefined2 *)0x0) {
        uVar2 = 0;
      }
      else {
        *puVar4 = (short)*s;
        *(undefined1 *)(puVar4 + 2) = 0;
        uVar2 = flatcc_builder_end_struct(B);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar2 = flatcc_refmap_insert(B->refmap,s,uVar2);
        }
      }
    }
    FVar8 = (Fantasy_Character_union_ref_t)((ulong)uVar2 << 0x20 | 8);
    break;
  case 9:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,s);
    }
    if (uVar2 == 0) {
      piVar5 = (int *)flatcc_builder_start_struct(B,4,4);
      if (piVar5 == (int *)0x0) {
        uVar2 = 0;
      }
      else {
        *piVar5 = *s;
        uVar2 = flatcc_builder_end_struct(B);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar2 = flatcc_refmap_insert(B->refmap,s,uVar2);
        }
      }
    }
    FVar8 = (Fantasy_Character_union_ref_t)((ulong)uVar2 << 0x20 | 9);
    break;
  case 10:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,s);
    }
    if (uVar2 == 0) {
      piVar5 = (int *)flatcc_builder_start_struct(B,4,4);
      if (piVar5 == (int *)0x0) {
        uVar2 = 0;
      }
      else {
        *piVar5 = *s;
        uVar2 = flatcc_builder_end_struct(B);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar2 = flatcc_refmap_insert(B->refmap,s,uVar2);
        }
      }
    }
    FVar8 = (Fantasy_Character_union_ref_t)((ulong)uVar2 << 0x20 | 10);
    break;
  case 0xb:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,s);
    }
    if (uVar2 == 0) {
      if (s == (int *)0x0) {
        sVar7 = 0;
      }
      else {
        sVar7 = (size_t)(uint)s[-1];
      }
      uVar2 = flatcc_builder_create_string(B,(char *)s,sVar7);
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        uVar2 = flatcc_refmap_insert(B->refmap,s,uVar2);
      }
    }
    FVar8 = (Fantasy_Character_union_ref_t)((ulong)uVar2 << 0x20 | 0xb);
    break;
  default:
    if (uVar2 == 0xff) {
      if (B->refmap == (flatcc_refmap_t *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = flatcc_refmap_find(B->refmap,s);
      }
      if (uVar2 == 0) {
        if (s == (int *)0x0) {
          sVar7 = 0;
        }
        else {
          sVar7 = (size_t)(uint)s[-1];
        }
        uVar2 = flatcc_builder_create_string(B,(char *)s,sVar7);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar2 = flatcc_refmap_insert(B->refmap,s,uVar2);
        }
      }
      FVar8 = (Fantasy_Character_union_ref_t)((ulong)uVar2 << 0x20 | 0xff);
    }
  }
  return FVar8;
}

Assistant:

static Fantasy_Character_union_ref_t Fantasy_Character_clone(flatbuffers_builder_t *B, Fantasy_Character_union_t u)
{
    switch (u.type) {
    case 2: return Fantasy_Character_as_MuLan(Fantasy_Attacker_clone(B, (Fantasy_Attacker_table_t)u.value));
    case 8: return Fantasy_Character_as_Rapunzel(Fantasy_Rapunzel_clone(B, (Fantasy_Rapunzel_struct_t)u.value));
    case 9: return Fantasy_Character_as_Belle(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 10: return Fantasy_Character_as_BookFan(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 11: return Fantasy_Character_as_Other(flatbuffers_string_clone(B, u.value));
    case 255: return Fantasy_Character_as_Unused(flatbuffers_string_clone(B, u.value));
    default: return Fantasy_Character_as_NONE();
    }
}